

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O1

void __thiscall adios2::format::BP4Serializer::SerializeDataBuffer(BP4Serializer *this)

{
  IO *in_RSI;
  
  SerializeDataBuffer((BP4Serializer *)&this[-1].field_0x4f8,in_RSI);
  return;
}

Assistant:

void BP4Serializer::SerializeDataBuffer(core::IO &io) noexcept
{
    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // vars count and Length (only for PG)
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition,
                         &m_MetadataSet.DataPGVarsCount);
    // without record itself and vars count
    // Note: m_MetadataSet.DataPGVarsCount has been incremented by 4
    // in previous CopyToBuffer operation!
    const uint64_t varsLength = position - m_MetadataSet.DataPGVarsCountPosition - 8;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition, &varsLength);

    // each attribute is only written to output once
    size_t attributesSizeInData = GetAttributesSizeInData(io);
    if (attributesSizeInData)
    {
        attributesSizeInData += 12; // count + length + end ID
        // Take care not to shrink the buffer size in this.
        // Otherwise, growing the buffer again later on is expensive
        // - not because of reallocation, but because of (re)initialization
        // with zeros by BufferSTL::Resize.
        const size_t minSize = position + attributesSizeInData + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "when writing Attributes in rank=0\n");
        }
        PutAttributes(io);
    }
    else
    {
        const size_t minSize = position + 12 + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "for empty Attributes\n");
        }
        // Attribute index header for zero attributes: 0, 0LL
        // Resize() already takes care of this
        position += 12;
        absolutePosition += 12;
    }

    // write a block identifier PGI]
    const char pgiend[] = "PGI]"; // no \0
    helper::CopyToBuffer(buffer, position, pgiend, sizeof(pgiend) - 1);
    absolutePosition += sizeof(pgiend) - 1;

    // Finish writing pg group length INCLUDING the record itself and
    // including the closing padding but NOT the opening [PGI
    const uint64_t dataPGLength = position - m_MetadataSet.DataPGLengthPosition;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGLengthPosition, &dataPGLength);

    m_MetadataSet.DataPGIsOpen = false;
}